

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

int tinyfd_messageBox(char *aTitle,char *aMessage,char *aDialogType,char *aIconType,
                     int aDefaultButton)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  char *__dest;
  FILE *__stream;
  char *pcVar6;
  undefined8 uVar7;
  long lVar8;
  char *__src;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  size_t sStack_4c0;
  termios infoOri;
  termios info;
  char lBuff [1024];
  
  lBuff[0] = '\0';
  if (aTitle == (char *)0x0) {
    lVar8 = 0x400;
  }
  else {
    sVar5 = strlen(aTitle);
    lVar8 = sVar5 + 0x400;
  }
  if (aMessage == (char *)0x0) {
    sVar5 = 0;
  }
  else {
    sVar5 = strlen(aMessage);
  }
  if ((aTitle == (char *)0x0) || (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 != 0)) {
    __dest = (char *)malloc(sVar5 + lVar8);
  }
  else {
    __dest = (char *)0x0;
  }
  iVar3 = osascriptPresent();
  if (iVar3 == 0) {
    iVar3 = kdialogPresent();
    uVar7 = 0x676f6c6169646b;
    if (iVar3 != 0) {
      if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0))
      goto LAB_001103a6;
      builtin_strncpy(__dest,"kdialog",8);
      iVar3 = kdialogPresent();
      if (iVar3 == 2) {
        sVar5 = strlen(__dest);
        memcpy(__dest + sVar5," --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)",
               0x41);
      }
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5," --",4);
      if ((aDialogType == (char *)0x0) ||
         (((iVar3 = strcmp("okcancel",aDialogType), iVar3 != 0 &&
           (iVar3 = strcmp("yesno",aDialogType), iVar3 != 0)) &&
          (iVar3 = strcmp("yesnocancel",aDialogType), iVar3 != 0)))) {
        if (aIconType == (char *)0x0) {
LAB_0010eeb5:
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"msgbox",7);
        }
        else {
          iVar3 = strcmp("error",aIconType);
          if (iVar3 == 0) {
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,"error",6);
          }
          else {
            iVar3 = strcmp("warning",aIconType);
            if (iVar3 != 0) goto LAB_0010eeb5;
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,"sorry",6);
          }
        }
      }
      else {
        if ((aIconType != (char *)0x0) &&
           ((iVar3 = strcmp("warning",aIconType), iVar3 == 0 ||
            (iVar3 = strcmp("error",aIconType), iVar3 == 0)))) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"warning",8);
        }
        iVar3 = strcmp("yesnocancel",aDialogType);
        sVar5 = strlen(__dest);
        if (iVar3 == 0) {
          builtin_strncpy(__dest + sVar5,"yesnocancel",0xc);
        }
        else {
          builtin_strncpy(__dest + sVar5,"yesno",6);
        }
      }
      sVar5 = strlen(__dest);
      (__dest + sVar5)[0] = ' ';
      (__dest + sVar5)[1] = '\"';
      __dest[sVar5 + 2] = '\0';
      if (aMessage != (char *)0x0) {
        strcat(__dest,aMessage);
      }
      sVar5 = strlen(__dest);
      (__dest + sVar5)[0] = '\"';
      (__dest + sVar5)[1] = '\0';
      if ((aDialogType != (char *)0x0) && (iVar3 = strcmp("okcancel",aDialogType), iVar3 == 0)) {
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5," --yes-label Ok --no-label Cancel",0x22);
      }
      if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5," --title \"",0xb);
        strcat(__dest,aTitle);
        sVar5 = strlen(__dest);
        (__dest + sVar5)[0] = '\"';
        (__dest + sVar5)[1] = '\0';
      }
      iVar3 = strcmp("yesnocancel",aDialogType);
      sVar5 = strlen(__dest);
      pcVar6 = __dest + sVar5;
      if (iVar3 != 0) {
        builtin_strncpy(__dest + sVar5 + 0x10,"hen echo 1;else echo 0;fi",0x1a);
        uVar11._0_1_ = ';';
        uVar11._1_1_ = 'i';
        uVar11._2_1_ = 'f';
        uVar11._3_1_ = ' ';
        uVar15._0_1_ = '[';
        uVar15._1_1_ = ' ';
        uVar15._2_1_ = '$';
        uVar15._3_1_ = '?';
        uVar20._0_1_ = ' ';
        uVar20._1_1_ = '=';
        uVar20._2_1_ = ' ';
        uVar20._3_1_ = '0';
        uVar24._0_1_ = ' ';
        uVar24._1_1_ = ']';
        uVar24._2_1_ = ';';
        uVar24._3_1_ = 't';
        goto LAB_0010f810;
      }
      __src = "; x=$? ;if [ $x = 0 ] ;then echo 1;elif [ $x = 1 ] ;then echo 2;else echo 0;fi";
      sStack_4c0 = 0x4f;
      goto LAB_0010f822;
    }
    iVar3 = zenityPresent();
    if ((iVar3 == 0) && (iVar3 = matedialogPresent(), iVar3 == 0)) {
      if (shellementaryPresent_lShellementaryPresent == '\0') {
        shellementaryPresent_lShellementaryPresent = '\x01';
      }
      iVar3 = qarmaPresent();
      if (iVar3 != 0) goto LAB_0010ef20;
      iVar3 = gxmessagePresent();
      if ((((iVar3 == 0) && (iVar3 = gmessagePresent(), iVar3 == 0)) &&
          (iVar3 = gdialogPresent(), iVar3 == 0)) &&
         ((iVar3 = xdialogPresent(), iVar3 == 0 && (iVar3 = tkinter2Present(), iVar3 != 0)))) {
        if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
          uVar17._0_1_ = 'o';
          uVar17._1_1_ = 'n';
          uVar17._2_1_ = '2';
          uVar17._3_1_ = '-';
LAB_00110487:
          tinyfd_response._4_2_ = (undefined2)uVar17;
          tinyfd_response[6] = SUB41(uVar17,2);
          tinyfd_response[7] = SUB41(uVar17,3);
          builtin_strncpy(tinyfd_response,"pyth",4);
          builtin_strncpy(tinyfd_response + 8,"tkinter",8);
          return 1;
        }
        strcpy(__dest,gPython2Name);
        iVar3 = isTerminalRunning();
        if ((iVar3 == 0) && (iVar3 = isDarwin(), iVar3 != 0)) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5," -i",4);
        }
        sVar5 = strlen(__dest);
        memcpy(__dest + sVar5,
               " -S -c \"import Tkinter,tkMessageBox;root=Tkinter.Tk();root.withdraw();",0x47);
        iVar3 = isDarwin();
        if (iVar3 != 0) {
          sVar5 = strlen(__dest);
          memcpy(__dest + sVar5,
                 "import os;os.system(\'\'\'/usr/bin/osascript -e \'tell app \\\"Finder\\\" to set frontmost of process \\\"Python\\\" to true\' \'\'\');"
                 ,0x78);
        }
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5,"res=tkMessageBox.",0x12);
        if (aDialogType == (char *)0x0) {
LAB_0011002d:
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"showinfo(",10);
        }
        else {
          iVar3 = strcmp("okcancel",aDialogType);
          if (iVar3 == 0) {
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,"askokcancel(",0xd);
            sVar5 = strlen(__dest);
            pcVar6 = __dest + sVar5;
            if (aDefaultButton == 0) {
              builtin_strncpy(__dest + sVar5 + 0xd,"sageBox.CANCEL,",0x10);
            }
            else {
              builtin_strncpy(__dest + sVar5 + 9,"kMessageBox.OK,",0x10);
            }
          }
          else {
            iVar3 = strcmp("yesno",aDialogType);
            if (iVar3 != 0) {
              iVar3 = strcmp("yesnocancel",aDialogType);
              if (iVar3 != 0) goto LAB_0011002d;
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5,"askyesnocancel(",0x10);
              if (aDefaultButton == 0) {
                sVar5 = strlen(__dest);
                builtin_strncpy(__dest + sVar5,"default=tkMessageBox.CANCEL,",0x1d);
              }
              else if (aDefaultButton == 2) {
                sVar5 = strlen(__dest);
                builtin_strncpy(__dest + sVar5,"default=tkMessageBox.NO,",0x19);
              }
              else if (aDefaultButton == 1) {
                sVar5 = strlen(__dest);
                builtin_strncpy(__dest + sVar5,"default=tkMessageBox.YES,",0x1a);
              }
              goto LAB_00110e29;
            }
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,"askyesno(",10);
            sVar5 = strlen(__dest);
            pcVar6 = __dest + sVar5;
            if (aDefaultButton == 0) {
              builtin_strncpy(__dest + sVar5 + 9,"kMessageBox.NO,",0x10);
            }
            else {
              builtin_strncpy(__dest + sVar5 + 10,"MessageBox.YES,",0x10);
            }
          }
          builtin_strncpy(pcVar6,"default=tkMessag",0x10);
        }
LAB_00110e29:
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5,"icon=\'",7);
        if ((aIconType == (char *)0x0) ||
           (((iVar3 = strcmp("question",aIconType), iVar3 != 0 &&
             (iVar3 = strcmp("error",aIconType), iVar3 != 0)) &&
            (iVar3 = strcmp("warning",aIconType), iVar3 != 0)))) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"info",5);
        }
        else {
          strcat(__dest,aIconType);
        }
        sVar5 = strlen(__dest);
        (__dest + sVar5)[0] = '\'';
        (__dest + sVar5)[1] = ',';
        __dest[sVar5 + 2] = '\0';
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"title=\'",8);
          strcat(__dest,aTitle);
          sVar5 = strlen(__dest);
          (__dest + sVar5)[0] = '\'';
          (__dest + sVar5)[1] = ',';
          __dest[sVar5 + 2] = '\0';
        }
        if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"message=\'",10);
          sVar5 = strlen(__dest);
          replaceSubStr(aMessage,"\n","\\n",__dest + sVar5);
          sVar5 = strlen(__dest);
          (__dest + sVar5)[0] = '\'';
          (__dest + sVar5)[1] = '\0';
        }
        if ((aDialogType != (char *)0x0) && (iVar3 = strcmp("yesnocancel",aDialogType), iVar3 == 0))
        {
          sVar5 = strlen(__dest);
          __src = 
          ");\nif res is None :\n\tprint 0\nelif res is False :\n\tprint 2\nelse :\n\tprint 1\n\"";
          sStack_4c0 = 0x4c;
LAB_00111144:
          pcVar6 = __dest + sVar5;
          goto LAB_0010f822;
        }
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5,");\nif res is False :\n\tprint 0\nel",0x20);
        uVar12._0_1_ = 's';
        uVar12._1_1_ = 'e';
        uVar12._2_1_ = ' ';
        uVar12._3_1_ = ':';
        uVar16._0_1_ = '\n';
        uVar16._1_1_ = '\t';
        uVar16._2_1_ = 'p';
        uVar16._3_1_ = 'r';
        uVar21._0_1_ = 'i';
        uVar21._1_1_ = 'n';
        uVar21._2_1_ = 't';
        uVar21._3_1_ = ' ';
        uVar25._0_1_ = '1';
        uVar25._1_1_ = '\n';
        uVar25._2_1_ = '\"';
        uVar25._3_1_ = '\0';
LAB_00110325:
        pcVar6 = __dest + sVar5 + 0x20;
        *(undefined4 *)pcVar6 = uVar12;
        *(undefined4 *)(pcVar6 + 4) = uVar16;
        *(undefined4 *)(pcVar6 + 8) = uVar21;
        *(undefined4 *)(pcVar6 + 0xc) = uVar25;
        goto LAB_0010f827;
      }
      iVar3 = gxmessagePresent();
      if ((((iVar3 == 0) && (iVar3 = gmessagePresent(), iVar3 == 0)) &&
          (iVar3 = gdialogPresent(), iVar3 == 0)) &&
         ((iVar3 = xdialogPresent(), iVar3 == 0 && (iVar3 = tkinter3Present(), iVar3 != 0)))) {
        if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
          uVar17._0_1_ = 'o';
          uVar17._1_1_ = 'n';
          uVar17._2_1_ = '3';
          uVar17._3_1_ = '-';
          goto LAB_00110487;
        }
        strcpy(__dest,gPython3Name);
        sVar5 = strlen(__dest);
        memcpy(__dest + sVar5,
               " -S -c \"import tkinter;from tkinter import messagebox;root=tkinter.Tk();root.withdraw();"
               ,0x59);
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5,"res=messagebox.",0x10);
        if (aDialogType == (char *)0x0) {
LAB_00110109:
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"showinfo(",10);
        }
        else {
          iVar3 = strcmp("okcancel",aDialogType);
          if (iVar3 == 0) {
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,"askokcancel(",0xd);
            sVar5 = strlen(__dest);
            pcVar6 = __dest + sVar5;
            if (aDefaultButton == 0) {
              builtin_strncpy(__dest + sVar5,"default=messagebox.CANCEL,",0x1b);
            }
            else {
              builtin_strncpy(__dest + sVar5,"default=messageb",0x10);
              uVar7 = 0x2c4b4f2e786f62;
LAB_00110fbb:
              *(undefined8 *)(pcVar6 + 0xf) = uVar7;
            }
          }
          else {
            iVar3 = strcmp("yesno",aDialogType);
            if (iVar3 == 0) {
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5,"askyesno(",10);
              sVar5 = strlen(__dest);
              pcVar6 = __dest + sVar5;
              if (aDefaultButton == 0) {
                builtin_strncpy(__dest + sVar5,"default=messageb",0x10);
                uVar7 = 0x2c4f4e2e786f62;
                goto LAB_00110fbb;
              }
              builtin_strncpy(__dest + sVar5,"default=messagebox.YES,",0x18);
            }
            else {
              iVar3 = strcmp("yesnocancel",aDialogType);
              if (iVar3 != 0) goto LAB_00110109;
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5,"askyesnocancel(",0x10);
              if (aDefaultButton == 0) {
                sVar5 = strlen(__dest);
                builtin_strncpy(__dest + sVar5,"default=messagebox.CANCEL,",0x1b);
              }
              else {
                if (aDefaultButton == 2) {
                  sVar5 = strlen(__dest);
                  builtin_strncpy(__dest + sVar5 + 0xf,"box.NO,",8);
                }
                else {
                  if (aDefaultButton != 1) goto LAB_00110fbf;
                  sVar5 = strlen(__dest);
                  builtin_strncpy(__dest + sVar5 + 0x10,"ox.YES,",8);
                }
                builtin_strncpy(__dest + sVar5,"default=messageb",0x10);
              }
            }
          }
        }
LAB_00110fbf:
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5,"icon=\'",7);
        if ((aIconType == (char *)0x0) ||
           (((iVar3 = strcmp("question",aIconType), iVar3 != 0 &&
             (iVar3 = strcmp("error",aIconType), iVar3 != 0)) &&
            (iVar3 = strcmp("warning",aIconType), iVar3 != 0)))) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"info",5);
        }
        else {
          strcat(__dest,aIconType);
        }
        sVar5 = strlen(__dest);
        (__dest + sVar5)[0] = '\'';
        (__dest + sVar5)[1] = ',';
        __dest[sVar5 + 2] = '\0';
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"title=\'",8);
          strcat(__dest,aTitle);
          sVar5 = strlen(__dest);
          (__dest + sVar5)[0] = '\'';
          (__dest + sVar5)[1] = ',';
          __dest[sVar5 + 2] = '\0';
        }
        if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"message=\'",10);
          sVar5 = strlen(__dest);
          replaceSubStr(aMessage,"\n","\\n",__dest + sVar5);
          sVar5 = strlen(__dest);
          (__dest + sVar5)[0] = '\'';
          (__dest + sVar5)[1] = '\0';
        }
        if ((aDialogType != (char *)0x0) && (iVar3 = strcmp("yesnocancel",aDialogType), iVar3 == 0))
        {
          sVar5 = strlen(__dest);
          __src = 
          ");\nif res is None :\n\tprint(0)\nelif res is False :\n\tprint(2)\nelse :\n\tprint 1\n\""
          ;
          sStack_4c0 = 0x4e;
          goto LAB_00111144;
        }
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5,");\nif res is False :\n\tprint(0)\nelse :\n\tprint(1)\n\"",
                        0x32);
        goto LAB_0010f827;
      }
      iVar3 = gxmessagePresent();
      if ((iVar3 != 0) || (iVar3 = gmessagePresent(), iVar3 != 0)) {
LAB_0010f993:
        iVar3 = gxmessagePresent();
        if (iVar3 == 0) {
          iVar3 = gmessagePresent();
          if (iVar3 == 0) {
            uVar7 = 0x6567617373656d78;
          }
          else {
            uVar7 = 0x6567617373656d67;
          }
          if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
            tinyfd_response._0_4_ = (undefined4)uVar7;
            tinyfd_response._4_2_ = (undefined2)((ulong)uVar7 >> 0x20);
            tinyfd_response[6] = (char)((ulong)uVar7 >> 0x30);
            tinyfd_response[7] = (char)((ulong)uVar7 >> 0x38);
            tinyfd_response[8] = '\0';
            return 1;
          }
          *(undefined8 *)__dest = uVar7;
          __dest[8] = '\0';
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
            builtin_strncpy(tinyfd_response,"gxmessage",10);
            return 1;
          }
          builtin_strncpy(__dest,"gxmessage",10);
        }
        if (aDialogType == (char *)0x0) {
LAB_0010fb27:
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5," -buttons Ok:1",0xf);
LAB_0010fb4c:
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5," -defaul",8);
          uVar7 = 0x6b4f20746c7561;
LAB_0010fb6c:
          *(undefined8 *)(__dest + sVar5 + 5) = uVar7;
        }
        else {
          iVar3 = strcmp("okcancel",aDialogType);
          if (iVar3 != 0) {
            iVar3 = strcmp("yesno",aDialogType);
            if (iVar3 == 0) {
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5," -buttons Yes:1,No:0",0x15);
              if (aDefaultButton != 0) {
LAB_0010fc7d:
                if (aDefaultButton == 1) {
                  sVar5 = strlen(__dest);
                  builtin_strncpy(__dest + sVar5," -default Yes",0xe);
                }
                goto LAB_0010fb71;
              }
            }
            else {
              iVar3 = strcmp("yesnocancel",aDialogType);
              if (iVar3 != 0) goto LAB_0010fb27;
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5," -buttons Yes:1,No:2,Cancel:0",0x1e);
              if (aDefaultButton == 0) goto LAB_0010fd13;
              if (aDefaultButton != 2) goto LAB_0010fc7d;
            }
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5," -defaul",8);
            uVar7 = 0x6f4e20746c7561;
            goto LAB_0010fb6c;
          }
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5," -buttons Ok:1,Cancel:0",0x18);
          if (aDefaultButton == 0) {
LAB_0010fd13:
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5," -default Cancel",0x11);
          }
          else if (aDefaultButton == 1) goto LAB_0010fb4c;
        }
LAB_0010fb71:
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5," -center \"",0xb);
        if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
          strcat(__dest,aMessage);
        }
        sVar5 = strlen(__dest);
        (__dest + sVar5)[0] = '\"';
        (__dest + sVar5)[1] = '\0';
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5," -title  \"",0xb);
          strcat(__dest,aTitle);
          sVar5 = strlen(__dest);
          (__dest + sVar5)[0] = '\"';
          (__dest + sVar5)[1] = '\0';
        }
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5," ; echo $? ",0xc);
        goto LAB_0010f827;
      }
      iVar3 = gdialogPresent();
      if ((iVar3 == 0) && (iVar3 = xdialogPresent(), iVar3 == 0)) {
        if (xmessagePresent_lXmessagePresent < 0) {
          xmessagePresent_lXmessagePresent = detectPresence("xmessage");
        }
        if ((xmessagePresent_lXmessagePresent != 0) && (iVar3 = graphicMode(), iVar3 != 0))
        goto LAB_0010f993;
      }
      iVar3 = xdialogPresent();
      if ((((iVar3 != 0) || (iVar3 = gdialogPresent(), iVar3 != 0)) ||
          (pcVar6 = dialogName(), pcVar6 != (char *)0x0)) || (iVar3 = whiptailPresent(), iVar3 != 0)
         ) {
        iVar3 = gdialogPresent();
        if (iVar3 == 0) {
          iVar3 = xdialogPresent();
          if (iVar3 != 0) {
            if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
              uVar7 = 0x676f6c61696478;
              goto LAB_001103a6;
            }
            uVar7 = 0x676f6c6169645828;
            goto LAB_0010fd63;
          }
          pcVar6 = dialogName();
          if (pcVar6 == (char *)0x0) {
            iVar3 = isTerminalRunning();
            if (iVar3 == 0) {
              if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
                builtin_strncpy(tinyfd_response,"whiptail",9);
                return 0;
              }
              pcVar6 = terminalName();
              strcpy(__dest,pcVar6);
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5,"\'(whiptail ",0xc);
              goto LAB_0011069e;
            }
            if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
              builtin_strncpy(tinyfd_response,"whiptail",9);
              return 0;
            }
            builtin_strncpy(__dest,"(whiptail ",0xb);
LAB_00110401:
            bVar2 = true;
            bVar9 = true;
          }
          else {
            if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
              builtin_strncpy(tinyfd_response,"dialog",7);
              return 0;
            }
            iVar3 = isTerminalRunning();
            if (iVar3 != 0) {
              builtin_strncpy(__dest,"(dialog ",9);
              goto LAB_00110401;
            }
            pcVar6 = terminalName();
            strcpy(__dest,pcVar6);
            sVar5 = strlen(__dest);
            (__dest + sVar5)[0] = '\'';
            (__dest + sVar5)[1] = '(';
            __dest[sVar5 + 2] = '\0';
            pcVar6 = dialogName();
            strcat(__dest,pcVar6);
            sVar5 = strlen(__dest);
            (__dest + sVar5)[0] = ' ';
            (__dest + sVar5)[1] = '\0';
LAB_0011069e:
            bVar9 = true;
            bVar2 = false;
          }
        }
        else {
          if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
            uVar7 = 0x676f6c61696467;
LAB_001103a6:
            tinyfd_response._0_4_ = (undefined4)uVar7;
            tinyfd_response._4_2_ = (undefined2)((ulong)uVar7 >> 0x20);
            tinyfd_response[6] = (char)((ulong)uVar7 >> 0x30);
            tinyfd_response[7] = '\0';
            return 1;
          }
          uVar7 = 0x676f6c6169646728;
LAB_0010fd63:
          *(undefined8 *)__dest = uVar7;
          __dest[8] = ' ';
          __dest[9] = '\0';
          bVar2 = true;
          bVar9 = false;
        }
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"--title \"",10);
          strcat(__dest,aTitle);
          sVar5 = strlen(__dest);
          (__dest + sVar5)[0] = '\"';
          (__dest + sVar5)[1] = ' ';
          __dest[sVar5 + 2] = '\0';
        }
        iVar3 = xdialogPresent();
        if ((iVar3 == 0) && (iVar3 = gdialogPresent(), aDialogType != (char *)0x0 && iVar3 == 0)) {
          iVar3 = strcmp("okcancel",aDialogType);
          if (((iVar3 == 0) || (iVar3 = strcmp("yesno",aDialogType), iVar3 == 0)) ||
             (iVar3 = strcmp("yesnocancel",aDialogType), iVar3 == 0)) {
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,"--backtitle \"",0xe);
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,"tab: move focus",0x10);
            sVar5 = strlen(__dest);
            (__dest + sVar5)[0] = '\"';
            (__dest + sVar5)[1] = ' ';
            __dest[sVar5 + 2] = '\0';
          }
LAB_0010fe6c:
          iVar3 = strcmp("okcancel",aDialogType);
          if (iVar3 == 0) {
            if (aDefaultButton == 0) {
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5,"--defaultno ",0xd);
            }
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,"--yes-label \"Ok\" --no-label \"Cancel\" --yesno ",0x2e)
            ;
          }
          else {
            iVar3 = strcmp("yesno",aDialogType);
            if (iVar3 == 0) {
              if (aDefaultButton == 0) {
                sVar5 = strlen(__dest);
                builtin_strncpy(__dest + sVar5,"--defaultno ",0xd);
              }
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5,"--yesno ",9);
            }
            else {
              iVar3 = strcmp("yesnocancel",aDialogType);
              if (iVar3 != 0) {
                bVar1 = false;
                goto LAB_0010fec8;
              }
              if (aDefaultButton == 0) {
                sVar5 = strlen(__dest);
                builtin_strncpy(__dest + sVar5,"--defaultno ",0xd);
              }
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5,"--menu ",8);
            }
          }
          bVar1 = false;
        }
        else {
          if (aDialogType != (char *)0x0) goto LAB_0010fe6c;
          bVar1 = true;
LAB_0010fec8:
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"--msgbox ",10);
        }
        sVar5 = strlen(__dest);
        (__dest + sVar5)[0] = '\"';
        (__dest + sVar5)[1] = '\0';
        if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
          strcat(__dest,aMessage);
        }
        sVar5 = strlen(__dest);
        (__dest + sVar5)[0] = '\"';
        (__dest + sVar5)[1] = ' ';
        __dest[sVar5 + 2] = '\0';
        if (!bVar9) {
          if ((bVar1) || (iVar3 = strcmp("yesnocancel",aDialogType), iVar3 != 0)) {
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5 + 0x2e,"ho 0;fi",8);
            builtin_strncpy(__dest + sVar5,"10 60 ) 2>&1;if [ $? = 0 ];then ",0x20);
            uVar12._0_1_ = 'e';
            uVar12._1_1_ = 'c';
            uVar12._2_1_ = 'h';
            uVar12._3_1_ = 'o';
            uVar16._0_1_ = ' ';
            uVar16._1_1_ = '1';
            uVar16._2_1_ = ';';
            uVar16._3_1_ = 'e';
            uVar21._0_1_ = 'l';
            uVar21._1_1_ = 's';
            uVar21._2_1_ = 'e';
            uVar21._3_1_ = ' ';
            uVar25._0_1_ = 'e';
            uVar25._1_1_ = 'c';
            uVar25._2_1_ = 'h';
            uVar25._3_1_ = 'o';
            goto LAB_00110325;
          }
          sVar5 = strlen(__dest);
          pcVar6 = __dest + sVar5;
          __src = 
          "0 60 0 Yes \"\" No \"\") 2>/tmp/tinyfd.txt;if [ $? = 0 ];then tinyfdBool=1;else tinyfdBool=0;fi;tinyfdRes=$(cat /tmp/tinyfd.txt);echo $tinyfdBool$tinyfdRes"
          ;
          sStack_4c0 = 0x98;
          goto LAB_0010f822;
        }
        if ((bVar1) || (iVar3 = strcmp("yesnocancel",aDialogType), iVar3 != 0)) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"10 60 >/dev/tty) 2>&1;if [ $? = 0 ];",0x25);
          sVar5 = strlen(__dest);
          pcVar6 = __dest + sVar5;
          if (!bVar2) {
            __src = 
            "then\n\techo 1\nelse\n\techo 0\nfi >/tmp/tinyfd.txt\';cat /tmp/tinyfd.txt;rm /tmp/tinyfd.txt"
            ;
            sStack_4c0 = 0x56;
            goto LAB_0010f822;
          }
          builtin_strncpy(__dest + sVar5 + 0x10," echo 0;fi;clear >/dev/tty",0x1b);
          uVar11._0_1_ = 't';
          uVar11._1_1_ = 'h';
          uVar11._2_1_ = 'e';
          uVar11._3_1_ = 'n';
          uVar15._0_1_ = ' ';
          uVar15._1_1_ = 'e';
          uVar15._2_1_ = 'c';
          uVar15._3_1_ = 'h';
          uVar20._0_1_ = 'o';
          uVar20._1_1_ = ' ';
          uVar20._2_1_ = '1';
          uVar20._3_1_ = ';';
          uVar24._0_1_ = 'e';
          uVar24._1_1_ = 'l';
          uVar24._2_1_ = 's';
          uVar24._3_1_ = 'e';
        }
        else {
          sVar5 = strlen(__dest);
          memcpy(__dest + sVar5,
                 "0 60 0 Yes \"\" No \"\" >/dev/tty ) 2>/tmp/tinyfd.txt;                if [ $? = 0 ];then tinyfdBool=1;else tinyfdBool=0;fi;                tinyfdRes=$(cat /tmp/tinyfd.txt);echo $tinyfdBool$tinyfdRes"
                 ,0xc3);
          sVar5 = strlen(__dest);
          pcVar6 = __dest + sVar5;
          if (bVar2) {
            builtin_strncpy(__dest + sVar5,"; clear >/dev/tty",0x12);
            goto LAB_0010f827;
          }
          builtin_strncpy(__dest + sVar5 + 0x10,"xt\';cat /tmp/tinyfd0.txt",0x19);
          uVar11._0_1_ = ' ';
          uVar11._1_1_ = '>';
          uVar11._2_1_ = '/';
          uVar11._3_1_ = 't';
          uVar15._0_1_ = 'm';
          uVar15._1_1_ = 'p';
          uVar15._2_1_ = '/';
          uVar15._3_1_ = 't';
          uVar20._0_1_ = 'i';
          uVar20._1_1_ = 'n';
          uVar20._2_1_ = 'y';
          uVar20._3_1_ = 'f';
          uVar24._0_1_ = 'd';
          uVar24._1_1_ = '0';
          uVar24._2_1_ = '.';
          uVar24._3_1_ = 't';
        }
        goto LAB_0010f810;
      }
      iVar3 = isTerminalRunning();
      if ((iVar3 == 0) && (pcVar6 = terminalName(), pcVar6 != (char *)0x0)) {
        if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
          builtin_strncpy(tinyfd_response,"basicinput",0xb);
          return 0;
        }
        pcVar6 = terminalName();
        strcpy(__dest,pcVar6);
        sVar5 = strlen(__dest);
        (__dest + sVar5)[0] = '\'';
        (__dest + sVar5)[1] = '\0';
        if (tinyfd_forceConsole == 0 && gWarningDisplayed == 0) {
          gWarningDisplayed = 1;
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"echo \"",7);
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"missing software! (we will try basic console input)",0x34)
          ;
          sVar5 = strlen(__dest);
          (__dest + sVar5)[0] = '\"';
          (__dest + sVar5)[1] = ';';
          __dest[sVar5 + 2] = '\0';
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"echo \"",7);
          sVar5 = strlen(__dest);
          memcpy(__dest + sVar5,
                 " ___________\n/           \\ \n| tiny file |\n|  dialogs  |\n\\_____  ____/\n      \\|\ntiny file dialogs on UNIX needs:\n   applescript\nor kdialog\nor zenity (or matedialog or qarma)\nor python (2 or 3)\n + tkinter + python-dbus (optional)\nor dialog (opens console if needed)\nor xterm + bash\n   (opens console for basic input)\nor existing console for basic input"
                 ,0x15f);
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"\";echo;echo;",0xd);
        }
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"echo \"",7);
          strcat(__dest,aTitle);
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"\";echo;",8);
        }
        if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"echo \"",7);
          strcat(__dest,aMessage);
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"\"; ",4);
        }
        if (aDialogType == (char *)0x0) {
LAB_001109de:
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"echo -n \"press enter to continue \"; ",0x25);
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"stty sane -echo;",0x11);
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"answer=$( while ! head -c 1;do true ;done);echo 1",0x32);
        }
        else {
          iVar3 = strcmp("yesno",aDialogType);
          if (iVar3 == 0) {
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,"echo -n \"y/n: \"; ",0x12);
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,"stty sane -echo;",0x11);
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,
                            "answer=$( while ! head -c 1 | grep -i [ny];do true ;done);",0x3b);
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5 + 0x20,"\";then\n",8);
            builtin_strncpy(__dest + sVar5,"if echo \"$answer",0x10);
            uVar26._0_1_ = ' ';
            uVar26._1_1_ = '\"';
            uVar26._2_1_ = '^';
            uVar26._3_1_ = 'y';
LAB_00111520:
            pcVar6 = __dest + sVar5 + 0x10;
            pcVar6[0] = '\"';
            pcVar6[1] = ' ';
            pcVar6[2] = '|';
            pcVar6[3] = ' ';
            pcVar6[4] = 'g';
            pcVar6[5] = 'r';
            pcVar6[6] = 'e';
            pcVar6[7] = 'p';
            pcVar6[8] = ' ';
            pcVar6[9] = '-';
            pcVar6[10] = 'i';
            pcVar6[0xb] = 'q';
            *(undefined4 *)(pcVar6 + 0xc) = uVar26;
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5 + 0x10,"ho 0\nfi",8);
            uVar13._0_1_ = '\t';
            uVar13._1_1_ = 'e';
            uVar13._2_1_ = 'c';
            uVar13._3_1_ = 'h';
            uVar18._0_1_ = 'o';
            uVar18._1_1_ = ' ';
            uVar18._2_1_ = '1';
            uVar18._3_1_ = '\n';
            uVar22._0_1_ = 'e';
            uVar22._1_1_ = 'l';
            uVar22._2_1_ = 's';
            uVar22._3_1_ = 'e';
            uVar27._0_1_ = '\n';
            uVar27._1_1_ = '\t';
            uVar27._2_1_ = 'e';
            uVar27._3_1_ = 'c';
          }
          else {
            iVar3 = strcmp("okcancel",aDialogType);
            if (iVar3 == 0) {
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5,"echo -n \"[O]kay/[C]ancel: \"; ",0x1e);
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5,"stty sane -echo;",0x11);
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5,
                              "answer=$( while ! head -c 1 | grep -i [oc];do true ;done);",0x3b);
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5 + 0x20,"\";then\n",8);
              builtin_strncpy(__dest + sVar5,"if echo \"$answer",0x10);
              uVar26._0_1_ = ' ';
              uVar26._1_1_ = '\"';
              uVar26._2_1_ = '^';
              uVar26._3_1_ = 'o';
              goto LAB_00111520;
            }
            iVar3 = strcmp("yesnocancel",aDialogType);
            if (iVar3 != 0) goto LAB_001109de;
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,"echo -n \"[Y]es/[N]o/[C]ancel: \"; ",0x22);
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,"stty sane -echo;",0x11);
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,
                            "answer=$( while ! head -c 1 | grep -i [nyc];do true ;done);",0x3c);
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,"if echo \"$answer\" | grep -iq \"^y\";then\n\techo 1\n",
                            0x30);
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,
                            "elif echo \"$answer\" | grep -iq \"^n\";then\n\techo 2\n",0x32);
            sVar5 = strlen(__dest);
            uVar13._0_1_ = 'e';
            uVar13._1_1_ = 'l';
            uVar13._2_1_ = 's';
            uVar13._3_1_ = 'e';
            uVar18._0_1_ = '\n';
            uVar18._1_1_ = '\t';
            uVar18._2_1_ = 'e';
            uVar18._3_1_ = 'c';
            uVar22._0_1_ = 'h';
            uVar22._1_1_ = 'o';
            uVar22._2_1_ = ' ';
            uVar22._3_1_ = '0';
            uVar27._0_1_ = '\n';
            uVar27._1_1_ = 'f';
            uVar27._2_1_ = 'i';
            uVar27._3_1_ = '\0';
          }
          pcVar6 = __dest + sVar5;
          *(undefined4 *)pcVar6 = uVar13;
          *(undefined4 *)(pcVar6 + 4) = uVar18;
          *(undefined4 *)(pcVar6 + 8) = uVar22;
          *(undefined4 *)(pcVar6 + 0xc) = uVar27;
        }
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5," >/tmp/tinyfd.txt\';cat /tmp/tinyfd.txt;rm /tmp/tinyfd.txt",
                        0x3a);
        goto LAB_0010f827;
      }
      iVar3 = isTerminalRunning();
      if ((iVar3 != 0) || (iVar3 = pythonDbusPresent(), iVar3 == 0)) {
LAB_001104c6:
        iVar3 = isTerminalRunning();
        if ((iVar3 == 0) && (iVar3 = perlPresent(), 1 < iVar3)) {
          uVar4 = (byte)*aDialogType - 0x6f;
          if ((uVar4 == 0) && (uVar4 = (byte)aDialogType[1] - 0x6b, uVar4 == 0)) {
            uVar4 = (uint)(byte)aDialogType[2];
          }
          if (uVar4 == 0) {
            pcVar6 = "";
            if ((aTitle != (char *)0x0) &&
               (iVar3 = strcmp(aTitle,"tinyfd_query"), pcVar6 = aTitle, iVar3 == 0)) {
              builtin_strncpy(tinyfd_response,"perl-dbus",10);
              return 1;
            }
            if (aIconType == (char *)0x0) {
              aIconType = "";
            }
            if (aMessage == (char *)0x0) {
              aMessage = "";
            }
            sprintf(__dest,
                    "perl -e \"use Net::DBus;                                                                 my \\$sessionBus = Net::DBus->session;                                                                 my \\$notificationsService = \\$sessionBus->get_service(\'org.freedesktop.Notifications\');                                                                 my \\$notificationsObject = \\$notificationsService->get_object(\'/org/freedesktop/Notifications\',                                                                 \'org.freedesktop.Notifications\');                                                                 my \\$notificationId;\\$notificationId = \\$notificationsObject->Notify(shift, 0, \'%s\', \'%s\', \'%s\', [], {}, -1);\" "
                    ,aIconType,pcVar6,aMessage);
            goto LAB_0010f827;
          }
        }
        iVar3 = isTerminalRunning();
        if ((iVar3 == 0) && (iVar3 = notifysendPresent(), iVar3 != 0)) {
          uVar4 = (byte)*aDialogType - 0x6f;
          if ((uVar4 == 0) && (uVar4 = (byte)aDialogType[1] - 0x6b, uVar4 == 0)) {
            uVar4 = (uint)(byte)aDialogType[2];
          }
          if (uVar4 == 0) {
            if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
              builtin_strncpy(tinyfd_response,"notifysend",0xb);
              return 1;
            }
            builtin_strncpy(__dest,"notify-send",0xc);
            if ((aIconType != (char *)0x0) && (*aIconType != '\0')) {
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5," -i \'",6);
              strcat(__dest,aIconType);
              sVar5 = strlen(__dest);
              (__dest + sVar5)[0] = '\'';
              (__dest + sVar5)[1] = '\0';
            }
            sVar5 = strlen(__dest);
            (__dest + sVar5)[0] = ' ';
            (__dest + sVar5)[1] = '\"';
            __dest[sVar5 + 2] = '\0';
            if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
              strcat(__dest,aTitle);
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5," | ",4);
            }
            if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
              replaceSubStr(aMessage,"\n\t"," |  ",lBuff);
              replaceSubStr(aMessage,"\n"," | ",lBuff);
              replaceSubStr(aMessage,"\t","  ",lBuff);
              strcat(__dest,lBuff);
            }
            sVar5 = strlen(__dest);
            (__dest + sVar5)[0] = '\"';
            (__dest + sVar5)[1] = '\0';
            goto LAB_0010f827;
          }
        }
        if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
          builtin_strncpy(tinyfd_response,"basicinput",0xb);
          return 0;
        }
        if (tinyfd_forceConsole == 0 && gWarningDisplayed == 0) {
          gWarningDisplayed = 1;
          printf("\n\n%s\n","missing software! (we will try basic console input)");
          printf("%s\n\n",
                 " ___________\n/           \\ \n| tiny file |\n|  dialogs  |\n\\_____  ____/\n      \\|\ntiny file dialogs on UNIX needs:\n   applescript\nor kdialog\nor zenity (or matedialog or qarma)\nor python (2 or 3)\n + tkinter + python-dbus (optional)\nor dialog (opens console if needed)\nor xterm + bash\n   (opens console for basic input)\nor existing console for basic input"
                );
        }
        if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
          printf("\n%s\n",aTitle);
        }
        tcgetattr(0,(termios *)&infoOri);
        tcgetattr(0,(termios *)&info);
        info.c_lflag._0_1_ = (byte)info.c_lflag & 0xfd;
        info.c_cc[5] = '\0';
        info.c_cc[6] = '\x01';
        tcsetattr(0,0,(termios *)&info);
        if (aDialogType == (char *)0x0) {
LAB_00110602:
          if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
            printf("\n%s\n\n");
          }
          printf("press enter to continue ");
          fflush(_stdout);
          getchar();
          puts("\n");
LAB_0011064c:
          uVar4 = 1;
        }
        else {
          iVar3 = strcmp("yesno",aDialogType);
          if (iVar3 == 0) {
            do {
              if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
                printf("\n%s\n");
              }
              printf("y/n: ");
              fflush(_stdout);
              iVar3 = getchar();
              iVar3 = tolower(iVar3);
              puts("\n");
              iVar3 = iVar3 << 0x18;
            } while ((iVar3 != 0x79000000) && (iVar3 != 0x6e000000));
            bVar9 = iVar3 == 0x79000000;
          }
          else {
            iVar3 = strcmp("okcancel",aDialogType);
            if (iVar3 != 0) {
              iVar3 = strcmp("yesnocancel",aDialogType);
              if (iVar3 != 0) goto LAB_00110602;
              do {
                if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
                  printf("\n%s\n");
                }
                printf("[Y]es/[N]o/[C]ancel: ");
                fflush(_stdout);
                iVar3 = getchar();
                iVar3 = tolower(iVar3);
                puts("\n");
                iVar3 = iVar3 << 0x18;
                if (iVar3 == 0x63000000) break;
                if (iVar3 == 0x79000000) goto LAB_0011064c;
              } while (iVar3 != 0x6e000000);
              uVar4 = (uint)(iVar3 == 0x6e000000) * 2;
              goto LAB_001112fa;
            }
            do {
              if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
                printf("\n%s\n");
              }
              printf("[O]kay/[C]ancel: ");
              fflush(_stdout);
              iVar3 = getchar();
              iVar3 = tolower(iVar3);
              puts("\n");
              iVar3 = iVar3 << 0x18;
            } while ((iVar3 != 0x6f000000) && (iVar3 != 0x63000000));
            bVar9 = iVar3 == 0x6f000000;
          }
          uVar4 = (uint)bVar9;
        }
LAB_001112fa:
        tcsetattr(0,0,(termios *)&infoOri);
        goto LAB_0010f920;
      }
      uVar4 = (byte)*aDialogType - 0x6f;
      if ((uVar4 == 0) && (uVar4 = (byte)aDialogType[1] - 0x6b, uVar4 == 0)) {
        uVar4 = (uint)(byte)aDialogType[2];
      }
      if (uVar4 != 0) goto LAB_001104c6;
      if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
        builtin_strncpy(tinyfd_response,"python-dbus",0xc);
        return 1;
      }
      strcpy(__dest,gPythonName);
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5," -c \"import dbus;bus=dbus.SessionBus();",0x28);
      sVar5 = strlen(__dest);
      memcpy(__dest + sVar5,
             "notif=bus.get_object(\'org.freedesktop.Notifications\',\'/org/freedesktop/Notifications\');"
             ,0x58);
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5,
                      "notify=dbus.Interface(notif,\'org.freedesktop.Notifications\');",0x3e);
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5,"notify.Notify(\'\',0,\'",0x15);
      if ((aIconType != (char *)0x0) && (*aIconType != '\0')) {
        strcat(__dest,aIconType);
      }
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5,"\',\'",4);
      if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
        strcat(__dest,aTitle);
      }
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5,"\',\'",4);
      if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
        sVar5 = strlen(__dest);
        replaceSubStr(aMessage,"\n","\\n",__dest + sVar5);
      }
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5,"\',\'\',\'\',",8);
      uVar7 = 0x2229303030352c;
      goto LAB_0010f0de;
    }
LAB_0010ef20:
    iVar3 = zenityPresent();
    if (iVar3 == 0) {
      iVar3 = matedialogPresent();
      if (iVar3 == 0) {
        if (shellementaryPresent_lShellementaryPresent == '\0') {
          shellementaryPresent_lShellementaryPresent = '\x01';
        }
        if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
          builtin_strncpy(tinyfd_response,"qarma",6);
          return 1;
        }
        builtin_strncpy(__dest,"szAnswer=$(qarma",0x11);
        pcVar6 = getenv("SSH_TTY");
        if (pcVar6 == (char *)0x0) {
          sVar5 = strlen(__dest);
          pcVar6 = " --attach=$(xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
          sStack_4c0 = 0x41;
          goto LAB_0010f38f;
        }
      }
      else {
        if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
          builtin_strncpy(tinyfd_response,"matedialog",0xb);
          return 1;
        }
        builtin_strncpy(__dest,"szAnswer=$(matedialog",0x16);
      }
    }
    else {
      if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
        builtin_strncpy(tinyfd_response,"zenity",7);
        return 1;
      }
      builtin_strncpy(__dest,"szAnswer=$(zenity",0x12);
      iVar3 = zenity3Present();
      if ((3 < iVar3) && (pcVar6 = getenv("SSH_TTY"), pcVar6 == (char *)0x0)) {
        sVar5 = strlen(__dest);
        pcVar6 = " --attach=$(sleep .01;xprop -root 32x \'\t$0\' _NET_ACTIVE_WINDOW | cut -f 2)";
        sStack_4c0 = 0x4b;
LAB_0010f38f:
        memcpy(__dest + sVar5,pcVar6,sStack_4c0);
      }
    }
    sVar5 = strlen(__dest);
    builtin_strncpy(__dest + sVar5," --",4);
    if (aDialogType == (char *)0x0) {
LAB_0010f3ea:
      if (aIconType == (char *)0x0) {
LAB_0010f41d:
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5,"info",5);
      }
      else {
        iVar3 = strcmp("error",aIconType);
        if (iVar3 == 0) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"error",6);
        }
        else {
          iVar3 = strcmp("warning",aIconType);
          if (iVar3 != 0) goto LAB_0010f41d;
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"warning",8);
        }
      }
    }
    else {
      iVar3 = strcmp("okcancel",aDialogType);
      if (iVar3 == 0) {
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5,"question --ok-label=Ok --cancel-label=Cancel",0x2d);
      }
      else {
        iVar3 = strcmp("yesno",aDialogType);
        if (iVar3 == 0) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"question",9);
        }
        else {
          iVar3 = strcmp("yesnocancel",aDialogType);
          if (iVar3 != 0) goto LAB_0010f3ea;
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"list --column \"\" --hide-header \"Yes\" \"No\"",0x2a);
        }
      }
    }
    if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5," --title=\"",0xb);
      strcat(__dest,aTitle);
      sVar5 = strlen(__dest);
      (__dest + sVar5)[0] = '\"';
      (__dest + sVar5)[1] = '\0';
    }
    if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5," --no-wrap --text=\"",0x14);
      strcat(__dest,aMessage);
      sVar5 = strlen(__dest);
      (__dest + sVar5)[0] = '\"';
      (__dest + sVar5)[1] = '\0';
    }
    iVar3 = zenity3Present();
    if (iVar3 < 3) {
      iVar3 = zenityPresent();
      if (iVar3 == 0) {
        if (shellementaryPresent_lShellementaryPresent == '\0') {
          shellementaryPresent_lShellementaryPresent = '\x01';
        }
        iVar3 = qarmaPresent();
        if (iVar3 != 0) goto LAB_0010f6f2;
      }
    }
    else {
LAB_0010f6f2:
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5," --icon-name=dialog-",0x15);
      if ((aIconType == (char *)0x0) ||
         (((iVar3 = strcmp("question",aIconType), iVar3 != 0 &&
           (iVar3 = strcmp("error",aIconType), iVar3 != 0)) &&
          (iVar3 = strcmp("warning",aIconType), iVar3 != 0)))) {
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5,"information",0xc);
      }
      else {
        strcat(__dest,aIconType);
      }
    }
    if (tinyfd_silent != 0) {
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5," 2>/dev/null ",0xe);
    }
    iVar3 = strcmp("yesnocancel",aDialogType);
    sVar5 = strlen(__dest);
    pcVar6 = __dest + sVar5;
    if (iVar3 == 0) {
      __src = ");if [ $? = 1 ];then echo 0;elif [ $szAnswer = \"No\" ];then echo 2;else echo 1;fi";
      sStack_4c0 = 0x51;
LAB_0010f822:
      memcpy(pcVar6,__src,sStack_4c0);
    }
    else {
      builtin_strncpy(__dest + sVar5 + 0x10,"then echo 1;else echo 0;fi",0x1b);
      uVar11._0_1_ = ')';
      uVar11._1_1_ = ';';
      uVar11._2_1_ = 'i';
      uVar11._3_1_ = 'f';
      uVar15._0_1_ = ' ';
      uVar15._1_1_ = '[';
      uVar15._2_1_ = ' ';
      uVar15._3_1_ = '$';
      uVar20._0_1_ = '?';
      uVar20._1_1_ = ' ';
      uVar20._2_1_ = '=';
      uVar20._3_1_ = ' ';
      uVar24._0_1_ = '0';
      uVar24._1_1_ = ' ';
      uVar24._2_1_ = ']';
      uVar24._3_1_ = ';';
LAB_0010f810:
      *(undefined4 *)pcVar6 = uVar11;
      *(undefined4 *)(pcVar6 + 4) = uVar15;
      *(undefined4 *)(pcVar6 + 8) = uVar20;
      *(undefined4 *)(pcVar6 + 0xc) = uVar24;
    }
  }
  else {
    if ((aTitle != (char *)0x0) && (iVar3 = strcmp(aTitle,"tinyfd_query"), iVar3 == 0)) {
      builtin_strncpy(tinyfd_response,"applescript",0xc);
      return 1;
    }
    builtin_strncpy(__dest,"osascript ",0xb);
    iVar3 = osx9orBetter();
    if (iVar3 == 0) {
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5," -e \'tell application \"System Events\"\' -e \'Activate\'",
                      0x35);
    }
    sVar5 = strlen(__dest);
    memcpy(__dest + sVar5,
           " -e \'try\' -e \'set {vButton} to {button returned} of ( display dialog \"",0x47);
    if ((aMessage != (char *)0x0) && (*aMessage != '\0')) {
      strcat(__dest,aMessage);
    }
    sVar5 = strlen(__dest);
    (__dest + sVar5)[0] = '\"';
    (__dest + sVar5)[1] = ' ';
    __dest[sVar5 + 2] = '\0';
    if ((aTitle != (char *)0x0) && (*aTitle != '\0')) {
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5,"with title \"",0xd);
      strcat(__dest,aTitle);
      sVar5 = strlen(__dest);
      (__dest + sVar5)[0] = '\"';
      (__dest + sVar5)[1] = ' ';
      __dest[sVar5 + 2] = '\0';
    }
    sVar5 = strlen(__dest);
    builtin_strncpy(__dest + sVar5,"with icon ",0xb);
    if (aIconType == (char *)0x0) {
LAB_0010edba:
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5,"note",4);
LAB_0010efa5:
      (__dest + sVar5 + 4)[0] = ' ';
      (__dest + sVar5 + 4)[1] = '\0';
    }
    else {
      iVar3 = strcmp("error",aIconType);
      if (iVar3 == 0) {
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5,"stop",4);
        goto LAB_0010efa5;
      }
      iVar3 = strcmp("warning",aIconType);
      if (iVar3 != 0) goto LAB_0010edba;
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5,"caution ",9);
    }
    if (aDialogType == (char *)0x0) {
LAB_0010eff6:
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5,"buttons {\"OK\"} ",0x10);
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5 + 0xd,"n \"OK\" ",8);
      uVar10._0_1_ = 'd';
      uVar10._1_1_ = 'e';
      uVar10._2_1_ = 'f';
      uVar10._3_1_ = 'a';
      uVar14._0_1_ = 'u';
      uVar14._1_1_ = 'l';
      uVar14._2_1_ = 't';
      uVar14._3_1_ = ' ';
      uVar19._0_1_ = 'b';
      uVar19._1_1_ = 'u';
      uVar19._2_1_ = 't';
      uVar19._3_1_ = 't';
      uVar23._0_1_ = 'o';
      uVar23._1_1_ = 'n';
      uVar23._2_1_ = ' ';
      uVar23._3_1_ = '\"';
LAB_0010f027:
      pcVar6 = __dest + sVar5;
      *(undefined4 *)pcVar6 = uVar10;
      *(undefined4 *)(pcVar6 + 4) = uVar14;
      *(undefined4 *)(pcVar6 + 8) = uVar19;
      *(undefined4 *)(pcVar6 + 0xc) = uVar23;
    }
    else {
      iVar3 = strcmp("okcancel",aDialogType);
      if (iVar3 == 0) {
        if (aDefaultButton == 0) {
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"default button \"Cancel\" ",0x19);
        }
      }
      else {
        iVar3 = strcmp("yesno",aDialogType);
        if (iVar3 != 0) {
          iVar3 = strcmp("yesnocancel",aDialogType);
          if (iVar3 != 0) goto LAB_0010eff6;
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5,"buttons {\"No\", \"Yes\", \"Cancel\"} ",0x21);
          if (aDefaultButton == 0) {
            sVar5 = strlen(__dest);
            builtin_strncpy(__dest + sVar5,"default button \"Cancel\" ",0x19);
          }
          else {
            if (aDefaultButton == 2) {
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5 + 0xd,"n \"No\" ",8);
            }
            else {
              if (aDefaultButton != 1) goto LAB_0010f5fc;
              sVar5 = strlen(__dest);
              builtin_strncpy(__dest + sVar5 + 0xe," \"Yes\" ",8);
            }
            builtin_strncpy(__dest + sVar5,"default button \"",0x10);
          }
LAB_0010f5fc:
          sVar5 = strlen(__dest);
          builtin_strncpy(__dest + sVar5 + 0xf,"Cancel\"",8);
          uVar10._0_1_ = 'c';
          uVar10._1_1_ = 'a';
          uVar10._2_1_ = 'n';
          uVar10._3_1_ = 'c';
          uVar14._0_1_ = 'e';
          uVar14._1_1_ = 'l';
          uVar14._2_1_ = ' ';
          uVar14._3_1_ = 'b';
          uVar19._0_1_ = 'u';
          uVar19._1_1_ = 't';
          uVar19._2_1_ = 't';
          uVar19._3_1_ = 'o';
          uVar23._0_1_ = 'n';
          uVar23._1_1_ = ' ';
          uVar23._2_1_ = '\"';
          uVar23._3_1_ = 'C';
          goto LAB_0010f027;
        }
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5,"buttons {\"No\", \"Yes\"} ",0x17);
        sVar5 = strlen(__dest);
        if (aDefaultButton == 0) {
          builtin_strncpy(__dest + sVar5,"default button \"No\" ",0x15);
        }
        else {
          builtin_strncpy(__dest + sVar5,"default button \"Yes\" ",0x16);
        }
        sVar5 = strlen(__dest);
        builtin_strncpy(__dest + sVar5,"cancel button \"No\"",0x13);
      }
    }
    sVar5 = strlen(__dest);
    builtin_strncpy(__dest + sVar5,")\' ",4);
    sVar5 = strlen(__dest);
    memcpy(__dest + sVar5,
           "-e \'if vButton is \"Yes\" then\' -e \'return 1\' -e \'else if vButton is \"OK\" then\' -e \'return 1\' -e \'else if vButton is \"No\" then\' -e \'return 2\' -e \'else\' -e \'return 0\' -e \'end if\' "
           ,0xb1);
    sVar5 = strlen(__dest);
    builtin_strncpy(__dest + sVar5,"-e \'on error number -128\' ",0x1b);
    sVar5 = strlen(__dest);
    builtin_strncpy(__dest + sVar5,"-e \'0\' ",8);
    sVar5 = strlen(__dest);
    builtin_strncpy(__dest + sVar5,"-e \'end try\'",0xd);
    iVar3 = osx9orBetter();
    if (iVar3 == 0) {
      sVar5 = strlen(__dest);
      builtin_strncpy(__dest + sVar5," -e \'end",8);
      uVar7 = 0x276c6c65742064;
LAB_0010f0de:
      *(undefined8 *)(__dest + sVar5 + 7) = uVar7;
    }
  }
LAB_0010f827:
  if (tinyfd_verbose != 0) {
    printf("lDialogString: %s\n",__dest);
  }
  __stream = popen(__dest,"r");
  if (__stream == (FILE *)0x0) {
    free(__dest);
    return 0;
  }
  do {
    pcVar6 = fgets(lBuff,0x400,__stream);
  } while (pcVar6 != (char *)0x0);
  pclose(__stream);
  sVar5 = strlen(lBuff);
  if (lBuff[sVar5 - 1] == '\n') {
    info.c_cc[sVar5 + 0x2a] = '\0';
  }
  if (((aDialogType != (char *)0x0) && (iVar3 = strcmp("yesnocancel",aDialogType), iVar3 == 0)) &&
     (lBuff[0] == '1')) {
    if (lBuff._1_4_ == 0x736559) {
      lBuff[0] = '1';
      lBuff[1] = '\0';
      lBuff[2] = 'e';
      lBuff[3] = 's';
      lBuff[4] = '\0';
    }
    else {
      iVar3 = bcmp(lBuff + 1,"No",3);
      if (iVar3 == 0) {
        lBuff[0] = '2';
        lBuff._1_4_ = lBuff._1_4_ & 0xffffff00;
      }
    }
  }
  uVar4 = 2;
  if (CONCAT11(lBuff[1],lBuff[0]) != 0x32) {
    uVar4 = (uint)(CONCAT11(lBuff[1],lBuff[0]) == 0x31);
  }
LAB_0010f920:
  free(__dest);
  return uVar4;
}

Assistant:

int tinyfd_messageBox(
        char const * const aTitle , /* NULL or "" */
        char const * const aMessage , /* NULL or ""  may contain \n and \t */
        char const * const aDialogType , /* "ok" "okcancel" "yesno" "yesnocancel" */
        char const * const aIconType , /* "info" "warning" "error" "question" */
        int const aDefaultButton ) /* 0 for cancel/no , 1 for ok/yes , 2 for no in yesnocancel */
{
        char lChar ;

#ifndef TINYFD_NOLIB
        if ((!tinyfd_forceConsole || !(GetConsoleWindow() || dialogPresent()))
                && (!getenv("SSH_CLIENT") || getenv("DISPLAY")))
        {
                if (aTitle&&!strcmp(aTitle, "tinyfd_query")){ strcpy(tinyfd_response, "windows"); return 1; }
                if (tinyfd_winUtf8)
                {
                        return messageBoxWinGui8(
                                aTitle, aMessage, aDialogType, aIconType, aDefaultButton);
                }
                else
                {
                        return messageBoxWinGuiA(
                                aTitle, aMessage, aDialogType, aIconType, aDefaultButton);
                }
        }
        else
#endif /* TINYFD_NOLIB */
        if ( dialogPresent() )
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"dialog");return 0;}
                return messageBoxWinConsole(
                                        aTitle,aMessage,aDialogType,aIconType,aDefaultButton);
        }
        else
        {
                if (aTitle&&!strcmp(aTitle,"tinyfd_query")){strcpy(tinyfd_response,"basicinput");return 0;}
                if (!gWarningDisplayed && !tinyfd_forceConsole )
                {
                        gWarningDisplayed = 1; 
                        printf("\n\n%s\n", gTitle);
                        printf("%s\n\n", tinyfd_needs);
                }
                if ( aTitle && strlen(aTitle) )
                {
                        printf("\n%s\n\n", aTitle);
                }
                if ( aDialogType && !strcmp("yesno",aDialogType) )
                {
                        do
                        {
                                if ( aMessage && strlen(aMessage) )
                                {
                                        printf("%s\n",aMessage);
                                }
                                printf("y/n: ");
                                lChar = (char) tolower( _getch() ) ;
                                printf("\n\n");
                        }
                        while ( lChar != 'y' && lChar != 'n' ) ;
                        return lChar == 'y' ? 1 : 0 ;
                }
                else if ( aDialogType && !strcmp("okcancel",aDialogType) )
                {
                        do
                        {
                                if ( aMessage && strlen(aMessage) )
                                {
                                        printf("%s\n",aMessage);
                                }
                                printf("[O]kay/[C]ancel: ");
                                lChar = (char) tolower( _getch() ) ;
                                printf("\n\n");
                        }
                        while ( lChar != 'o' && lChar != 'c' ) ;
                        return lChar == 'o' ? 1 : 0 ;
                }
                else if (aDialogType && !strcmp("yesnocancel", aDialogType))
                {
                        do
                        {
                                if (aMessage && strlen(aMessage))
                                {
                                        printf("%s\n", aMessage);
                                }
                                printf("[Y]es/[N]o/[C]ancel: ");
                                lChar = (char)tolower(_getch());
                                printf("\n\n");
                        } while (lChar != 'y' && lChar != 'n' && lChar != 'c');
                        return (lChar == 'y') ? 1 : (lChar == 'n') ? 2 : 0 ;
                }
                else
                {
                        if ( aMessage && strlen(aMessage) )
                        {
                                printf("%s\n\n",aMessage);
                        }
                        printf("press enter to continue ");
                        lChar = (char) _getch() ;
                        printf("\n\n");
                        return 1 ;
                }
        }
}